

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O3

XformEvaluator * __thiscall
tinyusdz::anon_unknown_4::XformEvaluator::RotateY(XformEvaluator *this,double angle)

{
  double dVar1;
  double x;
  double dVar2;
  bool bVar3;
  matrix4d *in_RCX;
  long lVar4;
  matrix4d *pmVar5;
  matrix4d *pmVar6;
  byte bVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  double dVar10;
  double dVar11;
  matrix4d m;
  matrix4d ret;
  matrix4d local_120;
  matrix4d local_a0;
  
  bVar7 = 0;
  local_120.m[0][3] = 0.0;
  local_120.m[1][0] = 0.0;
  local_120.m[0][1] = 0.0;
  local_120.m[0][2] = 0.0;
  local_120.m[1][1] = 1.0;
  local_120.m[1][2] = 0.0;
  local_120.m[1][3] = 0.0;
  local_120.m[2][0] = 0.0;
  local_120.m[2][1] = 0.0;
  local_120.m[2][3] = 0.0;
  local_120.m[3][0] = 0.0;
  local_120.m[3][1] = 0.0;
  local_120.m[3][2] = 0.0;
  local_120.m[3][3] = 1.0;
  x = angle / 180.0;
  if (0.25 <= ABS(x)) {
    dVar11 = -x;
    if (-x <= x) {
      dVar11 = x;
    }
    dVar1 = floor(dVar11);
    dVar11 = dVar11 - dVar1;
    bVar3 = 0.5 < dVar11;
    if (0.5 < dVar11) {
      dVar11 = 1.0 - dVar11;
    }
    dVar10 = dVar11 + -0.5;
    local_120.m[0][0] = 0.0;
    if ((dVar10 != 0.0) || (NAN(dVar10))) {
      dVar2 = ABS(dVar11);
      if (dVar2 <= 0.5) {
        dVar2 = 0.5;
      }
      if (dVar2 * 0.0 < ABS(dVar10)) {
        if (dVar11 <= 0.25) {
          dVar11 = cos(dVar11 * 3.141592653589793);
          uVar8 = SUB84(dVar11,0);
          uVar9 = (undefined4)((ulong)dVar11 >> 0x20);
        }
        else {
          dVar11 = sin((0.5 - dVar11) * 3.141592653589793);
          uVar8 = SUB84(dVar11,0);
          uVar9 = (undefined4)((ulong)dVar11 >> 0x20);
        }
        local_120.m[0][0] = (double)CONCAT44(uVar9,uVar8);
        if (((bVar3 ^ (byte)(int)dVar1) & 1) != 0) {
          local_120.m[0][0] = -local_120.m[0][0];
        }
      }
    }
  }
  else {
    local_120.m[0][0] = cos(x * 3.141592653589793);
  }
  local_120.m[2][0] = math::sin_pi_imp<double>(x);
  local_120.m[0][2] = -local_120.m[2][0];
  local_120.m[2][2] = local_120.m[0][0];
  tinyusdz::value::Mult<tinyusdz::value::matrix4d,double,4ul>
            (&local_a0,(value *)&this->m,&local_120,in_RCX);
  pmVar5 = &local_a0;
  pmVar6 = &this->m;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    pmVar6->m[0][0] = pmVar5->m[0][0];
    pmVar5 = (matrix4d *)((long)pmVar5 + ((ulong)bVar7 * -2 + 1) * 8);
    pmVar6 = (matrix4d *)((long)pmVar6 + (ulong)bVar7 * -0x10 + 8);
  }
  return this;
}

Assistant:

XformEvaluator &RotateY(const double angle) {  // in degrees

    value::matrix4d rm = value::matrix4d::identity();

    double k = angle / 180.0;
    double c = math::cos_pi(k);
    double s = math::sin_pi(k);

    rm.m[0][0] = c;
    rm.m[0][2] = -s;
    rm.m[2][0] = s;
    rm.m[2][2] = c;

    m = m * rm;

    return (*this);
  }